

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid.cpp
# Opt level: O0

int __thiscall
ncnn::HardSigmoid::forward_inplace(HardSigmoid *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  long in_RSI;
  long in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  int local_90;
  int in_stack_ffffffffffffff84;
  Mat *in_stack_ffffffffffffff88;
  int local_2c;
  
  iVar1 = *(int *)(in_RSI + 0x2c);
  iVar2 = *(int *)(in_RSI + 0x30);
  iVar3 = *(int *)(in_RSI + 0x38);
  for (local_2c = 0; local_2c < iVar3; local_2c = local_2c + 1) {
    ncnn::Mat::channel(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    pfVar4 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff80);
    ncnn::Mat::~Mat((Mat *)0x919e15);
    for (local_90 = 0; local_90 < iVar1 * iVar2; local_90 = local_90 + 1) {
      if (*(float *)(in_RDI + 0xd8) <= pfVar4[local_90]) {
        if (pfVar4[local_90] < *(float *)(in_RDI + 0xdc) ||
            pfVar4[local_90] == *(float *)(in_RDI + 0xdc)) {
          pfVar4[local_90] =
               pfVar4[local_90] * *(float *)(in_RDI + 0xd0) + *(float *)(in_RDI + 0xd4);
        }
        else {
          pfVar4[local_90] = 1.0;
        }
      }
      else {
        pfVar4[local_90] = 0.0;
      }
    }
  }
  return 0;
}

Assistant:

int HardSigmoid::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < lower)
                ptr[i] = 0.f;
            else if (ptr[i] > upper)
                ptr[i] = 1.f;
            else
                ptr[i] = ptr[i] * alpha + beta;
        }
    }

    return 0;
}